

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall libtorrent::peer_connection::second_tick(peer_connection *this,int tick_interval_ms)

{
  undefined1 *puVar1;
  int *piVar2;
  _Atomic_word *p_Var3;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *plVar4;
  byte bVar5;
  byte bVar6;
  int32_t iVar7;
  session_settings *psVar8;
  session_interface *psVar9;
  torrent_peer *ptVar10;
  undefined1 auVar11 [16];
  _WordT _Var12;
  bool bVar13;
  char cVar14;
  uint uVar15;
  uint uVar16;
  piece_index_t new_piece;
  int iVar17;
  int iVar18;
  long lVar19;
  undefined4 extraout_var;
  alert_manager *paVar20;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _List_node_base *p_Var21;
  const_iterator __end1;
  long lVar22;
  ulong uVar23;
  element_type *peVar24;
  bool bVar25;
  shared_ptr<libtorrent::peer_connection> me;
  torrent *local_88;
  undefined1 local_80 [8];
  error_category *local_78;
  duration local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  int local_5c;
  undefined1 local_58 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_78 = (error_category *)local_80;
  local_70.__r = (rep)aux::time_now();
  std::__shared_ptr<libtorrent::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::peer_connection,void>
            ((__shared_ptr<libtorrent::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
             (local_58 + 0x18),
             (__weak_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::peer_connection>);
  local_68 = (this->super_peer_connection_hot_members).m_torrent.
             super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_68 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88 = (torrent *)0x0;
  }
  else {
    iVar17 = local_68->_M_use_count;
    do {
      if (iVar17 == 0) {
        local_88 = (torrent *)0x0;
        local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_001f9669;
      }
      LOCK();
      iVar18 = local_68->_M_use_count;
      bVar25 = iVar17 == iVar18;
      if (bVar25) {
        local_68->_M_use_count = iVar17 + 1;
        iVar18 = iVar17;
      }
      iVar17 = iVar18;
      UNLOCK();
    } while (!bVar25);
    if (local_68->_M_use_count == 0) {
      local_88 = (torrent *)0x0;
    }
    else {
      local_88 = (this->super_peer_connection_hot_members).m_torrent.
                 super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
LAB_001f9669:
  psVar8 = (this->super_peer_connection_hot_members).m_settings;
  local_78._0_1_ = 0;
  local_80 = (undefined1  [8])&psVar8->m_mutex;
  local_5c = tick_interval_ms;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
  local_78._0_1_ = true;
  _Var12 = (psVar8->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
  if (((uint)_Var12 >> 0x10 & 1) == 0) {
LAB_001f96a4:
    if (local_88 != (torrent *)0x0) goto LAB_001f9723;
LAB_001f984f:
    bVar25 = false;
  }
  else {
    if (local_88 == (torrent *)0x0) goto LAB_001f984f;
    psVar9 = (this->super_peer_connection_hot_members).m_ses;
    uVar15 = (*(psVar9->super_session_logger)._vptr_session_logger[0x34])
                       (psVar9,&(this->super_peer_connection_hot_members).field_0x2c,
                        (ulong)(uint)(this->m_statistics).m_stat[5].m_counter,
                        (ulong)(uint)(this->m_statistics).m_stat[4].m_counter);
    psVar9 = (this->super_peer_connection_hot_members).m_ses;
    uVar16 = (*(psVar9->super_session_logger)._vptr_session_logger[0x34])
                       (psVar9,&local_88->super_peer_class_set,
                        (ulong)(uint)(this->m_statistics).m_stat[5].m_counter,
                        (ulong)(uint)(this->m_statistics).m_stat[4].m_counter);
    if (((uVar16 | uVar15) != 0) &&
       (paVar20 = torrent::alerts(local_88), ((paVar20->m_alert_mask)._M_i.m_val >> 9 & 1) != 0)) {
      iVar17 = 0;
      iVar18 = 2;
      bVar25 = true;
      do {
        bVar13 = bVar25;
        if (((uVar16 | uVar15) >> iVar17 & 1) != 0) {
          paVar20 = torrent::alerts(local_88);
          torrent::get_handle((torrent *)local_58);
          local_80._0_4_ = iVar18;
          alert_manager::
          emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                    (paVar20,(torrent_handle *)local_58,(performance_warning_t *)local_80);
          if ((piece_picker *)local_58._8_8_ != (piece_picker *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              piVar2 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_58._8_8_)->
                                      super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                      ).
                                      super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 4);
              iVar17 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
            }
            else {
              iVar17 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_58._8_8_)->
                                       super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                       ).
                                       super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4);
              *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_58._8_8_)->
                              super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                              ).
                              super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar17 + -1;
            }
            if (iVar17 == 1) {
              (*(code *)(((vector<piece_pos,_piece_index_t> *)local_58._8_8_)->
                        super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                        ).
                        super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_start[3])();
            }
          }
        }
        iVar17 = 1;
        iVar18 = 3;
        bVar25 = false;
      } while (bVar13);
      goto LAB_001f96a4;
    }
LAB_001f9723:
    bVar5 = (this->super_peer_connection_hot_members).field_0x28;
    bVar25 = true;
    if ((bVar5 & 1) == 0) {
      if (((((~bVar5 & 0x14) == 0) &&
           ((this->m_download_queue).
            super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>.
            super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->m_download_queue).
            super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>.
            super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_finish)) &&
          ((this->m_request_queue).
           super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->m_request_queue).
           super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         ((this->m_last_request).__d.__r <= local_70.__r + -5000000000)) {
        (this->m_last_request).__d.__r = local_70.__r;
        bVar25 = request_a_block(local_88,this);
        if (bVar25) {
          counters::inc_stats_counter(this->m_counters,0x1f,1);
        }
        if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_001f98c1;
        send_block_requests(this);
      }
      if ((((local_88->field_0x5b0 & 8) != 0) &&
          (((local_88->super_torrent_hot_members).field_0x3b & 2) != 0)) &&
         (((this->field_0x763 & 1) == 0 &&
          ((this->m_became_uninterested).__d.__r + 10000000000 < local_70.__r)))) {
        new_piece = torrent::get_piece_to_super_seed
                              (local_88,&(this->super_peer_connection_hot_members).m_have_piece);
        superseed_piece(this,(piece_index_t)0xffffffff,new_piece);
      }
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2f])(this);
      iVar17 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
      if ((char)iVar17 == '\0') {
        plVar4 = &this->m_extensions;
        p_Var21 = (_List_node_base *)plVar4;
        while (p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                            *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var21 != (_List_node_base *)plVar4) {
          (**(code **)(*(long *)p_Var21[1]._M_next + 0xf0))();
        }
        iVar17 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
        if ((char)iVar17 == '\0') {
          lVar22 = local_70.__r - (this->m_last_receive).__d.__r;
          if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
            psVar8 = (this->super_peer_connection_hot_members).m_settings;
            local_78._0_1_ = 0;
            local_80 = (undefined1  [8])&psVar8->m_mutex;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
            local_78._0_1_ = true;
            iVar17 = (psVar8->m_store).m_ints._M_elems[0x11];
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
            if (this->m_peer_info != (torrent_peer *)0x0) {
              iVar17 = (*(uint *)&this->m_peer_info->field_0x1b & 0x1f) * 3 + iVar17;
            }
            bVar25 = aux::is_ssl((this->m_socket).
                                 super___shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
            bVar13 = aux::is_i2p((this->m_socket).
                                 super___shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
            iVar18 = iVar17 + 10;
            if (!bVar25) {
              iVar18 = iVar17;
            }
            iVar17 = iVar18 + 0x14;
            if (!bVar13) {
              iVar17 = iVar18;
            }
            if ((long)iVar17 * 1000000000 < lVar22) {
              _local_80 = errors::make_error_code(timed_out);
              p_Var21 = (_List_node_base *)plVar4;
              do {
                p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                             *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                if (p_Var21 == (_List_node_base *)plVar4) {
                  peer_log(this,info,"CONNECT_FAILED","waited %d seconds",
                           (ulong)(uint)((int)(SUB168(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),
                                                      8) >> 0x1a) -
                                        (SUB164(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),0xc)
                                        >> 0x1f)));
                  _local_80 = errors::make_error_code(timed_out);
                  connect_failed(this,(error_code *)local_80);
                  goto LAB_001f98c1;
                }
                cVar14 = (**(code **)(*(long *)p_Var21[1]._M_next + 200))
                                   (p_Var21[1]._M_next,local_80);
              } while (cVar14 != '\0');
            }
          }
          bVar5 = this->m_channel_state[1].m_val;
          if ((bVar5 & 4) != 0) {
            iVar17 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])(this);
            if ((((long)iVar17 * 1000000000 < lVar22) &&
                (((this->super_peer_connection_hot_members).field_0x28 & 2) == 0)) &&
               (this->m_reading_bytes == 0)) {
              _local_80 = errors::make_error_code(timed_out_inactivity);
              p_Var21 = (_List_node_base *)plVar4;
              do {
                p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                             *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                if (p_Var21 == (_List_node_base *)plVar4) {
                  peer_log(this,info,"LAST_ACTIVITY","%d seconds ago",
                           (ulong)(uint)((int)(SUB168(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),
                                                      8) >> 0x1a) -
                                        (SUB164(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),0xc)
                                        >> 0x1f)));
                  _local_80 = errors::make_error_code(timed_out_inactivity);
                  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_80,1,0);
                  goto LAB_001f98c1;
                }
                cVar14 = (**(code **)(*(long *)p_Var21[1]._M_next + 200))
                                   (p_Var21[1]._M_next,local_80);
              } while (cVar14 != '\0');
            }
          }
          psVar8 = (this->super_peer_connection_hot_members).m_settings;
          local_78._0_1_ = 0;
          local_80 = (undefined1  [8])&psVar8->m_mutex;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
          local_78._0_1_ = true;
          iVar17 = (psVar8->m_store).m_ints._M_elems[0x1b];
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
          bVar25 = aux::is_i2p((this->m_socket).
                               super___shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
          if (((((bVar5 & 4) == 0) ||
               (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0)) ||
              (iVar18 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(this),
              (char)iVar18 == '\0')) || (lVar22 <= (long)(iVar17 << bVar25 * '\x02') * 1000000000))
          {
            lVar22 = (this->m_last_incoming_request).__d.__r;
            lVar19 = (this->m_last_unchoke).__d.__r;
            if (lVar22 < lVar19) {
              lVar22 = lVar19;
            }
            lVar19 = (this->m_last_sent_payload).__d.__r;
            if (lVar22 <= lVar19) {
              lVar22 = lVar19;
            }
            if (((((bVar5 & 4) != 0) &&
                 (bVar6 = (this->super_peer_connection_hot_members).field_0x28, (bVar6 & 2) == 0))
                && (((bVar6 & 0x20) == 0 &&
                    (((this->m_requests).
                      super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      .
                      super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      (this->m_requests).
                      super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      .
                      super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      ._M_impl.super__Vector_impl_data._M_finish && (this->m_reading_bytes == 0)))))
                ) && ((this->field_0x763 & 1) != 0)) {
              bVar25 = torrent::is_finished(local_88);
              if ((bVar25 || (*(ulong *)&(local_88->super_torrent_hot_members).field_0x38 &
                             0x81000000) != 0) &&
                 (uVar23 = local_70.__r - lVar22, 60000000000 < (long)uVar23)) {
                _local_80 = errors::make_error_code(timed_out_no_request);
                p_Var21 = (_List_node_base *)plVar4;
                do {
                  p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                               *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                  if (p_Var21 == (_List_node_base *)plVar4) {
                    peer_log(this,info,"NO_REQUEST","waited %d seconds",uVar23 / 1000000000);
                    _local_80 = errors::make_error_code(timed_out_no_request);
                    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                              (this,local_80,1,0);
                    goto LAB_001f98c1;
                  }
                  cVar14 = (**(code **)(*(long *)p_Var21[1]._M_next + 200))
                                     (p_Var21[1]._M_next,local_80);
                } while (cVar14 != '\0');
              }
            }
            lVar22 = local_70.__r - (this->m_became_uninterested).__d.__r;
            peVar24 = (element_type *)(local_70.__r - (this->m_became_uninteresting).__d.__r);
            psVar8 = (this->super_peer_connection_hot_members).m_settings;
            local_78._0_1_ = 0;
            local_80 = (undefined1  [8])&psVar8->m_mutex;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
            local_78._0_1_ = true;
            iVar17 = (psVar8->m_store).m_ints._M_elems[0x13];
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
            if ((((bVar5 & 4) != 0) &&
                (((this->super_peer_connection_hot_members).field_0x28 & 0x10) == 0)) &&
               (lVar19 = (long)iVar17 * 1000000000,
               (lVar19 < (long)peVar24 & lVar19 < lVar22 & ~this->field_0x763) == 1)) {
              local_58._16_8_ = peVar24;
              iVar17 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[0x1e])();
              iVar18 = aux::session_settings::get_int
                                 ((this->super_peer_connection_hot_members).m_settings,0x4055);
              if ((iVar18 <= iVar17) ||
                 ((int)((uint)((ulong)*(undefined8 *)
                                       &(local_88->super_torrent_hot_members).field_0x38 >> 0x21) &
                       0xffffff) <=
                  (int)((ulong)((long)(local_88->super_torrent_hot_members).m_connections.
                                      super_vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                                      .
                                      super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_88->super_torrent_hot_members).m_connections.
                                     super_vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                                     .
                                     super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                  (int)((ulong)((long)(local_88->m_peers_to_disconnect).
                                      super__Vector_base<std::shared_ptr<libtorrent::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::peer_connection>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_88->m_peers_to_disconnect).
                                     super__Vector_base<std::shared_ptr<libtorrent::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::peer_connection>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
                _local_80 = errors::make_error_code(timed_out_no_interest);
                p_Var21 = (_List_node_base *)plVar4;
                do {
                  p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                               *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                  if (p_Var21 == (_List_node_base *)plVar4) {
                    iVar17 = (*(((this->super_peer_connection_hot_members).m_ses)->
                               super_session_logger)._vptr_session_logger[5])();
                    if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar17) + 0x68) < 0) {
                      auVar11 = SEXT816(lVar22) * SEXT816(0x112e0be826d694b3);
                      peer_log(this,info,"MUTUAL_NO_INTEREST","t1: %d t2: %d",
                               (ulong)(uint)((int)(auVar11._8_8_ >> 0x1a) - (auVar11._12_4_ >> 0x1f)
                                            ),
                               (ulong)(uint)((int)(SUB168(SEXT816((long)local_58._16_8_) *
                                                          SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                                            (SUB164(SEXT816((long)local_58._16_8_) *
                                                    SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)));
                    }
                    _local_80 = errors::make_error_code(timed_out_no_interest);
                    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                              (this,local_80,1,0);
                    goto LAB_001f98c1;
                  }
                  cVar14 = (**(code **)(*(long *)p_Var21[1]._M_next + 200))
                                     (p_Var21[1]._M_next,local_80);
                } while (cVar14 != '\0');
              }
            }
            if ((((bVar5 & 4) != 0) &&
                ((this->m_download_queue).
                 super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 .
                 super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 (this->m_download_queue).
                 super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 .
                 super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               ((0 < this->m_quota[1] &&
                (iVar17 = request_timeout(this),
                (long)iVar17 * 1000000000 + (this->m_requested).__d.__r < local_70.__r)))) {
              snub_peer(this);
            }
            keep_alive(this);
            if (((((this->field_0x763 & 0x10) != 0) && ((this->field_0x762 & 0x40) == 0)) &&
                (0 < this->m_downloaded_last_second)) &&
               ((this->m_statistics).m_stat[2].m_counter <= this->m_downloaded_last_second + 5000))
            {
              this->field_0x763 = this->field_0x763 & 0xef;
              iVar17 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[5])();
              if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar17) + 0x68) < 0) {
                peer_log(this,info,"SLOW_START","exit slow start: prev-dl: %d dl: %d",
                         (ulong)(uint)this->m_downloaded_last_second,
                         (ulong)(uint)(this->m_statistics).m_stat[2].m_counter);
              }
            }
            iVar17 = local_5c;
            iVar7 = (this->m_statistics).m_stat[0].m_counter;
            this->m_downloaded_last_second = (this->m_statistics).m_stat[2].m_counter;
            this->m_uploaded_last_second = iVar7;
            lVar22 = 0x6c8;
            do {
              stat_channel::second_tick
                        ((stat_channel *)
                         ((long)&(this->super_bandwidth_socket)._vptr_bandwidth_socket + lVar22),
                         iVar17);
              lVar22 = lVar22 + 0x10;
            } while (lVar22 != 0x728);
            iVar17 = (this->m_statistics).m_stat[0].m_5_sec_average;
            if (this->m_upload_rate_peak < iVar17) {
              this->m_upload_rate_peak = iVar17;
            }
            iVar17 = (this->m_statistics).m_stat[2].m_5_sec_average;
            if (this->m_download_rate_peak < iVar17) {
              this->m_download_rate_peak = iVar17;
            }
            iVar17 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
            if (((char)iVar17 == '\0') &&
               (((local_88->super_torrent_hot_members).field_0x3b & 2) != 0)) {
              update_desired_queue_size(this);
              if ((this->m_max_out_request_queue == (uint)this->m_desired_queue_size) &&
                 (paVar20 = torrent::alerts(local_88),
                 ((paVar20->m_alert_mask)._M_i.m_val >> 9 & 1) != 0)) {
                paVar20 = torrent::alerts(local_88);
                torrent::get_handle((torrent *)local_58);
                local_80._0_4_ = 1;
                alert_manager::
                emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                          (paVar20,(torrent_handle *)local_58,(performance_warning_t *)local_80);
                if ((piece_picker *)local_58._8_8_ != (piece_picker *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var3 = (_Atomic_word *)(local_58._8_8_ + 0xc);
                    iVar17 = *p_Var3;
                    *p_Var3 = *p_Var3 + -1;
                    UNLOCK();
                  }
                  else {
                    iVar17 = *(_Atomic_word *)(local_58._8_8_ + 0xc);
                    *(int *)(local_58._8_8_ + 0xc) = iVar17 + -1;
                  }
                  if (iVar17 == 1) {
                    (*(code *)(((vector<piece_pos,_piece_index_t> *)local_58._8_8_)->
                              super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                              ).
                              super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                              ._M_impl.super__Vector_impl_data._M_start[3])();
                  }
                }
              }
              iVar17 = aux::session_settings::get_int
                                 ((this->super_peer_connection_hot_members).m_settings,0x4004);
              if ((((this->m_download_queue).
                    super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                    .
                    super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (this->m_download_queue).
                    super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                    .
                    super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                    ._M_impl.super__Vector_impl_data._M_finish) && (0 < this->m_quota[1])) &&
                 ((long)iVar17 * 1000000000 < local_70.__r - (this->m_last_piece).__d.__r)) {
                iVar18 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)
                           ._vptr_session_logger[5])();
                if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar18) + 0x68) < 0) {
                  auVar11 = SEXT816(local_70.__r - (this->m_last_piece).__d.__r) *
                            SEXT816(0x112e0be826d694b3);
                  peer_log(this,info,"PIECE_REQUEST_TIMED_OUT","%d time: %d to: %d",
                           (ulong)(uint)((int)((ulong)((long)(this->m_download_queue).
                                                                                                                          
                                                  super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                                  .
                                                  super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->m_download_queue).
                                                                                                                
                                                  super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                                  .
                                                  super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                        -0x55555555),
                           (ulong)(uint)((int)(auVar11._8_8_ >> 0x1a) - (auVar11._12_4_ >> 0x1f)),
                           iVar17);
                }
                snub_peer(this);
              }
              fill_send_buffer(this);
            }
          }
          else {
            peer_log(this,info,"NO_HANDSHAKE","waited %d seconds",
                     (ulong)(uint)((int)(SUB168(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),8) >>
                                        0x1a) -
                                  (SUB164(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f
                                  )));
            _local_80 = errors::make_error_code(timed_out_no_handshake);
            (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_80,1,0);
          }
        }
      }
      goto LAB_001f98c1;
    }
  }
  if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe4,-1);
    if ((bVar25) &&
       (ptVar10 = this->m_peer_info, local_88->m_num_connecting = local_88->m_num_connecting - 1,
       (ptVar10->field_0x1b & 0x80) != 0)) {
      local_88->m_num_connecting_seeds = local_88->m_num_connecting_seeds - 1;
    }
    puVar1 = &(this->super_peer_connection_hot_members).field_0x28;
    *puVar1 = *puVar1 & 0xfd;
  }
  _local_80 = errors::make_error_code(torrent_aborted);
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_80,1,0);
LAB_001f98c1:
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

void peer_connection::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(is_single_thread());
		time_point const now = aux::time_now();
		std::shared_ptr<peer_connection> me(self());

		// the invariant check must be run before me is destructed
		// in case the peer got disconnected
		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = m_torrent.lock();

		int warning = 0;
		// drain the IP overhead from the bandwidth limiters
		if (m_settings.get_bool(settings_pack::rate_limit_ip_overhead) && t)
		{
			warning |= m_ses.use_quota_overhead(*this, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
			warning |= m_ses.use_quota_overhead(*t, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
		}

		if (warning && t->alerts().should_post<performance_alert>())
		{
			for (int channel = 0; channel < 2; ++channel)
			{
				if ((warning & (1 << channel)) == 0) continue;
				t->alerts().emplace_alert<performance_alert>(t->get_handle()
					, channel == peer_connection::download_channel
					? performance_alert::download_limit_too_low
					: performance_alert::upload_limit_too_low);
			}
		}

		if (!t || m_disconnecting)
		{
			TORRENT_ASSERT(t || !m_connecting);
			if (m_connecting)
			{
				m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
				if (t) t->dec_num_connecting(m_peer_info);
				m_connecting = false;
			}
			disconnect(errors::torrent_aborted, operation_t::bittorrent);
			return;
		}

		if (m_endgame_mode
			&& m_interesting
			&& m_download_queue.empty()
			&& m_request_queue.empty()
			&& now - seconds(5) >= m_last_request)
		{
			// this happens when we're in strict end-game
			// mode and the peer could not request any blocks
			// because they were all taken but there were still
			// unrequested blocks. Now, 5 seconds later, there
			// might not be any unrequested blocks anymore, so
			// we should try to pick another block to see
			// if we can pick a busy one
			m_last_request = now;
			if (request_a_block(*t, *this))
				m_counters.inc_stats_counter(counters::end_game_piece_picks);
			if (m_disconnecting) return;
			send_block_requests();
		}

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& t->ready_for_connections()
			&& !m_peer_interested
			&& m_became_uninterested + seconds(10) < now)
		{
			// maybe we need to try another piece, to see if the peer
			// become interested in us then
			superseed_piece(piece_index_t(-1), t->get_piece_to_super_seed(m_have_piece));
		}
#endif

		on_tick();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			e->tick();
		}
		if (is_disconnecting()) return;
#endif

		// if the peer hasn't said a thing for a certain
		// time, it is considered to have timed out
		time_duration d = now - m_last_receive;

		if (m_connecting)
		{
			int connect_timeout = m_settings.get_int(settings_pack::peer_connect_timeout);
			if (m_peer_info) connect_timeout += 3 * m_peer_info->failcount;

			// SSL and i2p handshakes are slow
			if (is_ssl(*m_socket))
				connect_timeout += 10;

#if TORRENT_USE_I2P
			if (is_i2p(*m_socket))
				connect_timeout += 20;
#endif

			if (d > seconds(connect_timeout)
				&& can_disconnect(errors::timed_out))
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CONNECT_FAILED", "waited %d seconds"
					, int(total_seconds(d)));
#endif
				connect_failed(errors::timed_out);
				return;
			}
		}

		// if we can't read, it means we're blocked on the rate-limiter
		// or the disk, not the peer itself. In this case, don't blame
		// the peer and disconnect it
		bool const may_timeout = bool(m_channel_state[download_channel] & peer_info::bw_network);

		// TODO: 2 use a deadline_timer for timeouts. Don't rely on second_tick()!
		// Hook this up to connect timeout as well. This would improve performance
		// because of less work in second_tick(), and might let use remove ticking
		// entirely eventually
		if (may_timeout && d > seconds(timeout()) && !m_connecting && m_reading_bytes == 0
			&& can_disconnect(errors::timed_out_inactivity))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "LAST_ACTIVITY", "%d seconds ago"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_inactivity, operation_t::bittorrent);
			return;
		}

		// do not stall waiting for a handshake
		int timeout = m_settings.get_int (settings_pack::handshake_timeout);
#if TORRENT_USE_I2P
		timeout *= is_i2p(*m_socket) ? 4 : 1;
#endif
		if (may_timeout
			&& !m_connecting
			&& in_handshake()
			&& d > seconds(timeout))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_HANDSHAKE", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_handshake, operation_t::bittorrent);
			return;
		}

		// disconnect peers that we unchoked, but they didn't send a request in
		// the last 60 seconds, and we haven't been working on servicing a request
		// for more than 60 seconds.
		// but only if we're a seed
		d = now - std::max(std::max(m_last_unchoke, m_last_incoming_request)
			, m_last_sent_payload);

		if (may_timeout
			&& !m_connecting
			&& m_requests.empty()
			&& m_reading_bytes == 0
			&& !m_choked
			&& m_peer_interested
			&& t && t->is_upload_only()
			&& d > seconds(60)
			&& can_disconnect(errors::timed_out_no_request))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_REQUEST", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_request, operation_t::bittorrent);
			return;
		}

		// if the peer hasn't become interested and we haven't
		// become interested in the peer for 10 minutes, it
		// has also timed out.
		time_duration const d1 = now - m_became_uninterested;
		time_duration const d2 = now - m_became_uninteresting;
		time_duration const time_limit = seconds(
			m_settings.get_int(settings_pack::inactivity_timeout));

		// don't bother disconnect peers we haven't been interested
		// in (and that hasn't been interested in us) for a while
		// unless we have used up all our connection slots
		if (may_timeout
			&& !m_interesting
			&& !m_peer_interested
			&& d1 > time_limit
			&& d2 > time_limit
			&& (m_ses.num_connections() >= m_settings.get_int(settings_pack::connections_limit)
				|| (t && t->num_peers() >= t->max_connections()))
			&& can_disconnect(errors::timed_out_no_interest))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "MUTUAL_NO_INTEREST", "t1: %d t2: %d"
					, int(total_seconds(d1)), int(total_seconds(d2)));
			}
#endif
			disconnect(errors::timed_out_no_interest, operation_t::bittorrent);
			return;
		}

		if (may_timeout
			&& !m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now > m_requested + seconds(request_timeout()))
		{
			snub_peer();
		}

		// if we haven't sent something in too long, send a keep-alive
		keep_alive();

		// if our download rate isn't increasing significantly anymore, end slow
		// start. The 10kB is to have some slack here.
		// we can't do this when we're choked, because we aren't sending any
		// requests yet, so there hasn't been an opportunity to ramp up the
		// connection yet.
		if (m_slow_start
			&& !m_peer_choked
			&& m_downloaded_last_second > 0
			&& m_downloaded_last_second + 5000
				>= m_statistics.last_payload_downloaded())
		{
			m_slow_start = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "SLOW_START", "exit slow start: "
					"prev-dl: %d dl: %d"
					, int(m_downloaded_last_second)
					, m_statistics.last_payload_downloaded());
			}
#endif
		}
		m_downloaded_last_second = m_statistics.last_payload_downloaded();
		m_uploaded_last_second = m_statistics.last_payload_uploaded();

		m_statistics.second_tick(tick_interval_ms);

		if (m_statistics.upload_payload_rate() > m_upload_rate_peak)
		{
			m_upload_rate_peak = m_statistics.upload_payload_rate();
		}
		if (m_statistics.download_payload_rate() > m_download_rate_peak)
		{
			m_download_rate_peak = m_statistics.download_payload_rate();
		}
		if (is_disconnecting()) return;

		if (!t->ready_for_connections()) return;

		update_desired_queue_size();

		if (m_desired_queue_size == m_max_out_request_queue
			&& t->alerts().should_post<performance_alert>())
		{
			t->alerts().emplace_alert<performance_alert>(t->get_handle()
				, performance_alert::outstanding_request_limit_reached);
		}

		int const piece_timeout = m_settings.get_int(settings_pack::piece_timeout);

		if (!m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now - m_last_piece > seconds(piece_timeout))
		{
			// this peer isn't sending the pieces we've
			// requested (this has been observed by BitComet)
			// in this case we'll clear our download queue and
			// re-request the blocks.
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "PIECE_REQUEST_TIMED_OUT"
					, "%d time: %d to: %d"
					, int(m_download_queue.size()), int(total_seconds(now - m_last_piece))
					, piece_timeout);
			}
#endif

			snub_peer();
		}

		fill_send_buffer();
	}